

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cc
# Opt level: O2

string * __thiscall
flow::MatchInstr::to_string_abi_cxx11_(string *__return_storage_ptr__,MatchInstr *this)

{
  string *this_00;
  allocator<char> local_91;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  switch(this->op_) {
  case Same:
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"match.same",&local_91);
    Instr::formatOne(__return_storage_ptr__,(Instr *)this,&local_30);
    this_00 = &local_30;
    break;
  case Head:
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"match.head",&local_91);
    Instr::formatOne(__return_storage_ptr__,(Instr *)this,&local_50);
    this_00 = &local_50;
    break;
  case Tail:
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"match.tail",&local_91);
    Instr::formatOne(__return_storage_ptr__,(Instr *)this,&local_70);
    this_00 = &local_70;
    break;
  case RegExp:
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"match.re",&local_91);
    Instr::formatOne(__return_storage_ptr__,(Instr *)this,&local_90);
    this_00 = &local_90;
    break;
  default:
    abort();
  }
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

std::unique_ptr<Instr> StoreInstr::clone() {
  return std::make_unique<StoreInstr>(variable(), index(), source(), name());
}